

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayCase::createInstance
          (TextureGather2DArrayCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize offsetSize;
  VkPhysicalDeviceProperties *pVVar1;
  TextureGather2DArrayInstance *this_00;
  anon_unknown_0 local_38 [8];
  undefined1 local_30 [8];
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  iterations;
  Context *context_local;
  TextureGather2DArrayCase *this_local;
  
  gatherType = (this->m_baseParams).gatherType;
  offsetSize = (this->m_baseParams).offsetSize;
  iterations.
  super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)context;
  pVVar1 = Context::getDeviceProperties(context);
  getOffsetRange(local_38,offsetSize,&pVVar1->limits);
  generate2DArrayCaseIterations
            ((vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
              *)local_30,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)local_38,
             &this->m_textureSize);
  this_00 = (TextureGather2DArrayInstance *)operator_new(0x2e0);
  TextureGather2DArrayInstance::TextureGather2DArrayInstance
            (this_00,(Context *)
                     iterations.
                     super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_baseParams,
             &this->m_textureSize,
             (vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
              *)local_30);
  std::
  vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
  ::~vector((vector<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
             *)local_30);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGather2DArrayCase::createInstance (Context& context) const
{
	const vector<Gather2DArrayArgs>		iterations	= generate2DArrayCaseIterations(m_baseParams.gatherType,
																					m_baseParams.textureFormat,
																					getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits),
																					m_textureSize);

	return new TextureGather2DArrayInstance(context, m_baseParams, m_textureSize, iterations);
}